

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O3

InputParameter<0UL,_ruckig::StandardVector> * __thiscall
ruckig::InputParameter<0UL,_ruckig::StandardVector>::operator=
          (InputParameter<0UL,_ruckig::StandardVector> *this,
          InputParameter<0UL,_ruckig::StandardVector> *param_1)

{
  ControlInterface CVar1;
  Synchronization SVar2;
  bool bVar3;
  undefined7 uVar4;
  
  this->duration_discretization = param_1->duration_discretization;
  CVar1 = param_1->control_interface;
  SVar2 = param_1->synchronization;
  this->degrees_of_freedom = param_1->degrees_of_freedom;
  this->control_interface = CVar1;
  this->synchronization = SVar2;
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->current_position,&param_1->current_position);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->current_velocity,&param_1->current_velocity);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->current_acceleration,&param_1->current_acceleration);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->target_position,&param_1->target_position);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->target_velocity,&param_1->target_velocity);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->target_acceleration,&param_1->target_acceleration);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->max_velocity,&param_1->max_velocity);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->max_acceleration,&param_1->max_acceleration);
  std::vector<double,_std::allocator<double>_>::operator=(&this->max_jerk,&param_1->max_jerk);
  std::_Optional_payload_base<std::vector<double,_std::allocator<double>_>_>::_M_copy_assign
            ((_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &this->min_velocity,
             (_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &param_1->min_velocity);
  std::_Optional_payload_base<std::vector<double,_std::allocator<double>_>_>::_M_copy_assign
            ((_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &this->min_acceleration,
             (_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &param_1->min_acceleration);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->intermediate_positions,&param_1->intermediate_positions);
  std::
  _Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&this->per_section_max_velocity,
                   (_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&param_1->per_section_max_velocity);
  std::
  _Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&this->per_section_max_acceleration,
                   (_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&param_1->per_section_max_acceleration);
  std::
  _Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&this->per_section_max_jerk,
                   (_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&param_1->per_section_max_jerk);
  std::
  _Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&this->per_section_min_velocity,
                   (_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&param_1->per_section_min_velocity);
  std::
  _Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&this->per_section_min_acceleration,
                   (_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&param_1->per_section_min_acceleration);
  std::
  _Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&this->per_section_max_position,
                   (_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&param_1->per_section_max_position);
  std::
  _Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&this->per_section_min_position,
                   (_Optional_payload_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&param_1->per_section_min_position);
  std::_Optional_payload_base<std::vector<double,_std::allocator<double>_>_>::_M_copy_assign
            ((_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &this->max_position,
             (_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &param_1->max_position);
  std::_Optional_payload_base<std::vector<double,_std::allocator<double>_>_>::_M_copy_assign
            ((_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &this->min_position,
             (_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &param_1->min_position);
  std::vector<bool,_std::allocator<bool>_>::operator=(&this->enabled,&param_1->enabled);
  std::
  _Optional_payload_base<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>_>
                    *)&this->per_dof_control_interface,
                   (_Optional_payload_base<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>_>
                    *)&param_1->per_dof_control_interface);
  std::
  _Optional_payload_base<std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>_>
                    *)&this->per_dof_synchronization,
                   (_Optional_payload_base<std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>_>
                    *)&param_1->per_dof_synchronization);
  bVar3 = (param_1->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
          super__Optional_payload_base<double>._M_engaged;
  uVar4 = *(undefined7 *)
           &(param_1->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>.field_0x9;
  (this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload =
       (param_1->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double>._M_payload;
  (this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_engaged = bVar3;
  *(undefined7 *)
   &(this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>.field_0x9 = uVar4;
  std::_Optional_payload_base<std::vector<double,_std::allocator<double>_>_>::_M_copy_assign
            ((_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &this->per_section_minimum_duration,
             (_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &param_1->per_section_minimum_duration);
  bVar3 = (param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>.
          _M_payload.super__Optional_payload_base<double>._M_engaged;
  uVar4 = *(undefined7 *)
           &(param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>.
            _M_payload.super__Optional_payload_base<double>.field_0x9;
  (this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload =
       (param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload
       .super__Optional_payload_base<double>._M_payload;
  (this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_engaged = bVar3;
  *(undefined7 *)
   &(this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>.field_0x9 = uVar4;
  return this;
}

Assistant:

inline static double v_at_a_zero(double v0, double a0, double j) {
        return v0 + (a0 * a0) / (2 * j);
    }